

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

void burstsort_bagwell(uchar **strings,size_t n)

{
  TrieNode<unsigned_char> *this;
  TrieNode<unsigned_char> *root;
  size_t n_local;
  uchar **strings_local;
  
  this = (TrieNode<unsigned_char> *)operator_new(0x820);
  TrieNode<unsigned_char>::TrieNode(this);
  insert<16000u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
            (this,strings,n);
  traverse<vector_bagwell<unsigned_char*,16u>,void(*)(unsigned_char**,int,int),unsigned_char>
            (this,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort_bagwell(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<16000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}